

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minigzip.c
# Opt level: O2

void file_uncompress(char *file)

{
  int iVar1;
  size_t sVar2;
  gzFile in;
  FILE *out;
  char *__name;
  char *__filename;
  undefined8 uStack_430;
  char buf [1024];
  
  __filename = buf;
  uStack_430 = (code *)0x1014ec;
  sVar2 = strlen(file);
  if (sVar2 - 0x3fd < 0xfffffffffffffc00) {
    uStack_430 = (code *)0x1015dd;
    fprintf(_stderr,"%s: filename too long\n",prog);
    goto LAB_0010160b;
  }
  uStack_430 = (code *)0x101523;
  snprintf(buf,0x400,"%s",file);
  if (sVar2 < 4) {
LAB_00101541:
    uStack_430 = (code *)0x101560;
    snprintf(buf + sVar2,0x400 - sVar2,"%s",".gz");
    __name = buf;
    __filename = file;
  }
  else {
    uStack_430 = (code *)0x10153d;
    iVar1 = strcmp(file + (sVar2 - 3),".gz");
    if (iVar1 != 0) goto LAB_00101541;
    buf[sVar2 - 3] = '\0';
    __name = file;
  }
  uStack_430 = (code *)0x101572;
  in = (gzFile)gzopen(__name,"rb");
  if (in == (gzFile)0x0) {
    uStack_430 = (code *)0x101601;
    fprintf(_stderr,"%s: can\'t gzopen %s\n",prog,__name);
  }
  else {
    uStack_430 = (code *)0x101589;
    out = fopen(__filename,"wb");
    if (out != (FILE *)0x0) {
      uStack_430 = (code *)0x101599;
      gz_uncompress(in,(FILE *)out);
      uStack_430 = (code *)0x1015a1;
      unlink(__name);
      return;
    }
    uStack_430 = (code *)0x10160b;
    perror(file);
  }
LAB_0010160b:
  uStack_430 = main;
  exit(1);
}

Assistant:

void file_uncompress(file)
    char  *file;
{
    local char buf[MAX_NAME_LEN];
    char *infile, *outfile;
    FILE  *out;
    gzFile in;
    size_t len = strlen(file);

    if (len + strlen(GZ_SUFFIX) >= sizeof(buf)) {
        fprintf(stderr, "%s: filename too long\n", prog);
        exit(1);
    }

#if !defined(NO_snprintf) && !defined(NO_vsnprintf)
    snprintf(buf, sizeof(buf), "%s", file);
#else
    strcpy(buf, file);
#endif

    if (len > SUFFIX_LEN && strcmp(file+len-SUFFIX_LEN, GZ_SUFFIX) == 0) {
        infile = file;
        outfile = buf;
        outfile[len-3] = '\0';
    } else {
        outfile = file;
        infile = buf;
#if !defined(NO_snprintf) && !defined(NO_vsnprintf)
        snprintf(buf + len, sizeof(buf) - len, "%s", GZ_SUFFIX);
#else
        strcat(infile, GZ_SUFFIX);
#endif
    }
    in = gzopen(infile, "rb");
    if (in == NULL) {
        fprintf(stderr, "%s: can't gzopen %s\n", prog, infile);
        exit(1);
    }
    out = fopen(outfile, "wb");
    if (out == NULL) {
        perror(file);
        exit(1);
    }

    gz_uncompress(in, out);

    unlink(infile);
}